

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O3

void nuts_scratch_addr(char *scheme,size_t sz,char *addr)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar3 = strcmp(scheme,"inproc");
  if ((iVar3 == 0) || (iVar3 = strcmp(scheme,"abstract"), iVar3 == 0)) {
    uVar8 = nng_random();
    uVar4 = nng_random();
    uVar5 = nng_random();
    uVar6 = nng_random();
    snprintf(addr,sz,"%s://nuts%04x%04x%04x%04x",scheme,uVar8,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6
            );
    return;
  }
  bVar1 = *scheme;
  if (bVar1 < 0x75) {
    if (bVar1 != 0x69) {
      if ((bVar1 == 0x74) &&
         (((scheme[1] == 'c' && (scheme[2] == 'p')) || ((scheme[1] == 'l' && (scheme[2] == 's'))))))
      {
LAB_0012d765:
        pcVar12 = strchr(scheme,0x36);
        pcVar13 = "[::1]";
        if (pcVar12 == (char *)0x0) {
          pcVar13 = "127.0.0.1";
        }
        uVar2 = nuts_next_port();
        snprintf(addr,sz,"%s://%s:%u",scheme,pcVar13,(ulong)uVar2);
        return;
      }
      goto LAB_0012d7b8;
    }
    if ((scheme[1] != 'p') || (scheme[2] != 'c')) goto LAB_0012d7b8;
  }
  else {
    if (bVar1 == 0x75) {
      if ((scheme[1] == 'd') && (scheme[2] == 'p')) goto LAB_0012d765;
    }
    else if ((bVar1 == 0x77) && (scheme[1] == 's')) {
      pcVar13 = strchr(scheme,0x36);
      pcVar12 = "[::1]";
      if (pcVar13 == (char *)0x0) {
        pcVar12 = "127.0.0.1";
      }
      uVar2 = nuts_next_port();
      uVar7 = (uint)uVar2;
      uVar8 = nng_random();
      uVar10 = CONCAT44(extraout_var,uVar8);
      uVar8 = nng_random();
      uVar11 = CONCAT44(extraout_var_00,uVar8);
      uVar9 = nng_random();
      nng_random();
      pcVar13 = "%s://%s:%u/nuts%04x%04x%04x%04x";
      goto LAB_0012d845;
    }
LAB_0012d7b8:
    iVar3 = strncmp(scheme,"unix",4);
    if (iVar3 != 0) {
      nng_log_err("NUTS","Unknown scheme");
      abort();
    }
  }
  pcVar12 = getenv("TMPDIR");
  if ((pcVar12 == (char *)0x0) && (pcVar12 = getenv("TEMP"), pcVar12 == (char *)0x0)) {
    pcVar13 = getenv("TMP");
    pcVar12 = "/tmp";
    if (pcVar13 != (char *)0x0) {
      pcVar12 = pcVar13;
    }
  }
  uVar7 = nng_random();
  uVar8 = nng_random();
  uVar10 = (ulong)uVar8;
  uVar8 = nng_random();
  uVar11 = (ulong)uVar8;
  uVar9 = nng_random();
  pcVar13 = "%s://%s/nuts%04x%04x%04x%04x";
LAB_0012d845:
  snprintf(addr,sz,pcVar13,scheme,pcVar12,(ulong)uVar7,uVar10,uVar11,(ulong)uVar9);
  return;
}

Assistant:

void
nuts_scratch_addr(const char *scheme, size_t sz, char *addr)
{
	if ((strcmp(scheme, "inproc") == 0) ||
	    (strcmp(scheme, "abstract") == 0)) {
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
	}

	if ((strncmp(scheme, "tcp", 3) == 0) ||
	    (strncmp(scheme, "tls", 3) == 0) ||
	    (strncmp(scheme, "udp", 3) == 0)) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(
		    addr, sz, "%s://%s:%u", scheme, ip, nuts_next_port());
		return;
	}

	if (strncmp(scheme, "ws", 2) == 0) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(addr, sz, "%s://%s:%u/nuts%04x%04x%04x%04x",
		    scheme, ip, nuts_next_port(), nng_random(), nng_random(),
		    nng_random(), nng_random());
		return;
	}

	if ((strncmp(scheme, "ipc", 3) == 0) ||
	    (strncmp(scheme, "unix", 4) == 0)) {
#ifdef _WIN32
		// Windows doesn't place IPC names in the filesystem.
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
#else
		char *tmpdir;

		if (((tmpdir = getenv("TMPDIR")) == NULL) &&
		    ((tmpdir = getenv("TEMP")) == NULL) &&
		    ((tmpdir = getenv("TMP")) == NULL)) {
			tmpdir = "/tmp";
		}

		(void) snprintf(addr, sz, "%s://%s/nuts%04x%04x%04x%04x",
		    scheme, tmpdir, nng_random(), nng_random(), nng_random(),
		    nng_random());
		return;
#endif
	}

	// We should not be here.
	nng_log_err("NUTS", "Unknown scheme");
	abort();
}